

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O3

int linenoise::getColumns(int ifd,int ofd)

{
  int iVar1;
  ssize_t sVar2;
  size_t __n;
  uint uVar3;
  long lVar4;
  int cols;
  int rows;
  char buf [32];
  winsize ws;
  uint local_60;
  undefined1 local_5c [4];
  char local_58 [32];
  undefined1 local_38 [2];
  ushort local_36;
  
  iVar1 = ioctl(1,0x5413,local_38);
  if (local_36 == 0 || iVar1 == -1) {
    sVar2 = write(ofd,"\x1b[6n",4);
    if (sVar2 == 4) {
      lVar4 = 0;
      do {
        sVar2 = read(ifd,local_58 + lVar4,1);
        if ((sVar2 != 1) || (local_58[lVar4] == 'R')) goto LAB_00105eed;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x1f);
      lVar4 = 0x1f;
LAB_00105eed:
      local_58[lVar4] = '\0';
      if (((local_58[0] == '\x1b') && (local_58[1] == '[')) &&
         (iVar1 = __isoc99_sscanf(local_58 + 2,"%d;%d",local_5c,&local_60), uVar3 = local_60,
         iVar1 == 2)) {
        if (local_60 == 0xffffffff) {
          return 0x50;
        }
        sVar2 = write(ofd,"\x1b[999C",6);
        if (sVar2 != 6) {
          return 0x50;
        }
        sVar2 = write(ofd,"\x1b[6n",4);
        if (sVar2 != 4) {
          return 0x50;
        }
        lVar4 = 0;
        do {
          sVar2 = read(ifd,local_58 + lVar4,1);
          if ((sVar2 != 1) || (local_58[lVar4] == 'R')) goto LAB_00105fb3;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x1f);
        lVar4 = 0x1f;
LAB_00105fb3:
        local_58[lVar4] = '\0';
        if (local_58[0] != '\x1b') {
          return 0x50;
        }
        if (local_58[1] != '[') {
          return 0x50;
        }
        iVar1 = __isoc99_sscanf(local_58 + 2,"%d;%d",local_5c,&local_60);
        if (iVar1 != 2) {
          return 0x50;
        }
        if (local_60 == 0xffffffff) {
          return 0x50;
        }
        if ((int)local_60 <= (int)uVar3) {
          return local_60;
        }
        snprintf(local_58,0x20,"\x1b[%dD");
        __n = strlen(local_58);
        write(ofd,local_58,__n);
        return local_60;
      }
    }
    uVar3 = 0x50;
  }
  else {
    uVar3 = (uint)local_36;
  }
  return uVar3;
}

Assistant:

inline int getColumns(int ifd, int ofd) {
#ifdef _WIN32
    CONSOLE_SCREEN_BUFFER_INFO b;

    if (!GetConsoleScreenBufferInfo(hOut, &b)) return 80;
    return b.srWindow.Right - b.srWindow.Left;
#else
    struct winsize ws;

    if (ioctl(1, TIOCGWINSZ, &ws) == -1 || ws.ws_col == 0) {
        /* ioctl() failed. Try to query the terminal itself. */
        int start, cols;

        /* Get the initial position so we can restore it later. */
        start = getCursorPosition(ifd,ofd);
        if (start == -1) goto failed;

        /* Go to right margin and get position. */
        if (write(ofd,"\x1b[999C",6) != 6) goto failed;
        cols = getCursorPosition(ifd,ofd);
        if (cols == -1) goto failed;

        /* Restore position. */
        if (cols > start) {
            char seq[32];
            snprintf(seq,32,"\x1b[%dD",cols-start);
            if (write(ofd,seq,strlen(seq)) == -1) {
                /* Can't recover... */
            }
        }
        return cols;
    } else {
        return ws.ws_col;
    }

failed:
    return 80;
#endif
}